

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O2

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
          AsyncResult<int> *param,AsyncResult<int> *param_3,AsyncResult<int> *param_4,int *param_5)

{
  Function f;
  _Any_data local_88;
  long local_78;
  undefined8 local_70;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *local_40;
  undefined1 local_38 [24];
  AsyncResult<int> *local_20;
  int *local_18;
  
  local_38._0_8_ = &local_40;
  local_40 = fn;
  local_38._8_8_ = param;
  local_38._16_8_ = param_3;
  local_20 = param_4;
  local_18 = param_5;
  std::function<void()>::operator()
            ((function<void()> *)local_60._M_pod_data,(anon_class_40_5_11abe806 *)local_38);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = uStack_48;
  if (local_50 != 0) {
    local_88._M_unused._M_object = local_60._M_unused._M_object;
    local_88._8_8_ = local_60._8_8_;
    local_78 = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  operator()(this,(Function *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }